

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O2

void re2c::Range::append_overlapping(Range **head,Range **tail,Range *r)

{
  uint uVar1;
  uint u;
  Range *pRVar2;
  
  if (*head == (Range *)0x0) {
    pRVar2 = ran(r->lb,r->ub);
    *head = pRVar2;
  }
  else {
    uVar1 = (*tail)->ub;
    u = r->ub;
    if (r->lb <= uVar1) {
      if (u <= uVar1) {
        return;
      }
      (*tail)->ub = u;
      return;
    }
    pRVar2 = ran(r->lb,u);
    (*tail)->nx = pRVar2;
    pRVar2 = (*tail)->nx;
  }
  *tail = pRVar2;
  return;
}

Assistant:

void Range::append_overlapping (Range * & head, Range * & tail, const Range * r)
{
	if (!head)
	{
		head = Range::ran (r->lb, r->ub);
		tail = head;
	}
	else if (tail->ub < r->lb)
	{
		tail->nx = Range::ran (r->lb, r->ub);
		tail = tail->nx;
	}
	else if (tail->ub < r->ub)
	{
		tail->ub = r->ub;
	}
}